

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::SDLGraphicsSystem::initializeSDLOrQuitAndThrowError(SDLGraphicsSystem *this)

{
  Wrapper *pWVar1;
  int iVar2;
  undefined8 extraout_RAX;
  allocator<char> local_31;
  string local_30;
  
  pWVar1 = (this->sdl)._M_t.
           super___uniq_ptr_impl<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::SDL::interfaces::Wrapper_*,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
           .super__Head_base<0UL,_solitaire::SDL::interfaces::Wrapper_*,_false>._M_head_impl;
  iVar2 = (*pWVar1->_vptr_Wrapper[2])(pWVar1,0x20);
  if (iVar2 == 0) {
    this->isSDLInitialized = true;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Cannot initialize graphics system",&local_31);
  quitAndThrow(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void SDLGraphicsSystem::initializeSDLOrQuitAndThrowError() {
    if (sdl->init(SDL_INIT_VIDEO))
        quitAndThrow("Cannot initialize graphics system");

    isSDLInitialized = true;
}